

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ProgramNode * __thiscall
Parser::Program(Parser *this,FunctionListNode *functionList,TypeDeclNode *typeList,
               VarDeclNode *varList)

{
  int iVar1;
  uint uVar2;
  PointerNode *pointer;
  TypeNode *pTVar3;
  IdListNode *idlist;
  VarDeclNode *this_00;
  VarDeclNode *next;
  TokenNode *pTVar4;
  char *pcVar5;
  TypeDeclNode *this_01;
  ProgramNode *pPVar6;
  FunctionListNode *this_02;
  ulong uVar7;
  FunctionNode *varFunc;
  TypeDeclNode *local_40;
  
  local_40 = typeList;
  do {
    while( true ) {
      varFunc = (FunctionNode *)varList;
      uVar7 = (ulong)(uint)this->tok;
      varList = (VarDeclNode *)varFunc;
      if (uVar7 < 0x35) break;
LAB_0010ad13:
      Sync(this,this->tok,programFollowSet);
    }
    if ((0x8000001d00U >> (uVar7 & 0x3f) & 1) == 0) {
      if (uVar7 == 0) {
        Eat(this,0);
        pPVar6 = (ProgramNode *)operator_new(0x28);
        ProgramNode::ProgramNode(pPVar6,functionList,local_40,(VarDeclNode *)varFunc);
        uVar2 = lexical_analyzer_getLine();
        (*(pPVar6->super_ASTNode)._vptr_ASTNode[2])(pPVar6,(ulong)uVar2);
        return pPVar6;
      }
      if (uVar7 != 0x34) goto LAB_0010ad13;
      Eat(this,0x34);
      EatOrSkip(this,0x35,programFollowSet);
      EatOrSkip(this,0x24,programFollowSet);
      pTVar3 = Type(this);
      idlist = IdList(this);
      EatOrSkip(this,0x11,programFollowSet);
      this_00 = (VarDeclNode *)operator_new(0x28);
      next = VarDecl(this);
      VarDeclNode::VarDeclNode(this_00,pTVar3,idlist,next);
      uVar2 = lexical_analyzer_getLine();
      (*(this_00->super_ASTNode)._vptr_ASTNode[2])(this_00,(ulong)uVar2);
      EatOrSkip(this,0x25,programFollowSet);
      pTVar4 = (TokenNode *)operator_new(0x40);
      pcVar5 = EatOrSkip(this,10,programFollowSet);
      TokenNode::TokenNode(pTVar4,10,pcVar5);
      uVar2 = lexical_analyzer_getLine();
      (*(pTVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[2])(pTVar4,(ulong)uVar2);
      EatOrSkip(this,0x11,programFollowSet);
      this_01 = (TypeDeclNode *)operator_new(0x28);
      TypeDeclNode::TypeDeclNode(this_01,this_00,pTVar4,local_40);
      uVar2 = lexical_analyzer_getLine();
      (*(this_01->super_ASTNode)._vptr_ASTNode[2])(this_01,(ulong)uVar2);
      local_40 = TypeDecl(this,this_01);
    }
    else {
      pTVar3 = Type(this);
      pointer = Pointer(this);
      pTVar4 = (TokenNode *)operator_new(0x40);
      pcVar5 = EatOrSkip(this,10,programFollowSet);
      TokenNode::TokenNode(pTVar4,10,pcVar5);
      uVar2 = lexical_analyzer_getLine();
      (*(pTVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[2])(pTVar4,(ulong)uVar2);
      varList = (VarDeclNode *)ProgramAUX(this,pTVar3,pointer,pTVar4,(VarDeclNode *)varFunc);
      if (((FunctionNode *)varList != (FunctionNode *)0x0) &&
         ((pcVar5 = *(char **)((((FunctionNode *)varList)->super_ASTNode)._vptr_ASTNode[-1] + 8),
          pcVar5 == "12FunctionNode" ||
          ((*pcVar5 != '*' && (iVar1 = strcmp(pcVar5,"12FunctionNode"), iVar1 == 0)))))) {
        this_02 = (FunctionListNode *)operator_new(0x20);
        FunctionListNode::FunctionListNode(this_02,(FunctionNode *)varList,functionList);
        uVar2 = lexical_analyzer_getLine();
        (*(this_02->super_ASTNode)._vptr_ASTNode[2])(this_02,(ulong)uVar2);
        pPVar6 = ProgramList(this,this_02,local_40,(VarDeclNode *)varFunc);
        return pPVar6;
      }
    }
  } while( true );
}

Assistant:

ProgramNode *Parser::Program(FunctionListNode *functionList, TypeDeclNode *typeList, VarDeclNode *varList)
{
    switch (tok) {
        case TYPEDEF: {
            Eat(TYPEDEF);

            EatOrSkip(STRUCT, programFollowSet);
            EatOrSkip(LBRACE, programFollowSet);

            TypeNode *type = Type();
            IdListNode *idList = IdList();

            EatOrSkip(SEMICOLON, programFollowSet);

            VarDeclNode *varListNode = new VarDeclNode(type, idList, VarDecl());
            varListNode->setLine(lexical_analyzer_getLine());

            EatOrSkip(RBRACE, programFollowSet);

            TokenNode *id = new TokenNode(ID, EatOrSkip(ID, programFollowSet));
            id->setLine(lexical_analyzer_getLine());

            EatOrSkip(SEMICOLON, programFollowSet);

            typeList = new TypeDeclNode(varListNode, id, typeList);
            typeList->setLine(lexical_analyzer_getLine());

            typeList = TypeDecl(typeList);
            return Program(functionList, typeList, varList);
        }
        case INT:
        case FLOAT:
        case BOOL:
        case CHAR:
        case ID: {
            TypeNode *type = Type();
            PointerNode *pointer = Pointer();

            TokenNode *id = new TokenNode(ID, EatOrSkip(ID, programFollowSet));
            id->setLine(lexical_analyzer_getLine());


            ASTNode *ast = ProgramAUX(type, pointer, id, varList);
            if (ast != NULL && typeid(*ast) == typeid(FunctionNode)) {
                FunctionNode *f = (FunctionNode *) ast;

                functionList = new FunctionListNode(f, functionList);
                functionList->setLine(lexical_analyzer_getLine());

                return ProgramList(functionList, typeList, varList);
            }
            varList = (VarDeclNode *) ast;
            return Program(functionList, typeList, varList);
        }
        case ENDOFFILE: {
            Eat(ENDOFFILE);

            ProgramNode *programNode = new ProgramNode(functionList, typeList, varList);
            programNode->setLine(lexical_analyzer_getLine());

            return programNode;
        }
        default: {
            Sync(tok, programFollowSet);
            return Program(functionList, typeList, varList);
        }
    }
    ProgramNode *programNode = new ProgramNode(functionList, typeList, varList);
    programNode->setLine(lexical_analyzer_getLine());

    return programNode;
}